

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcZone::~IfcZone(IfcZone *this)

{
  ~IfcZone(this);
  operator_delete(this,0x108);
  return;
}

Assistant:

IfcZone() : Object("IfcZone") {}